

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O3

void calc<float>(options2 *opt)

{
  string *psVar1;
  func<float> fVar2;
  autodiff_fvar<float,_1UL> aVar3;
  int iVar4;
  int *piVar5;
  runtime_error *this;
  long *plVar6;
  ostream *poVar7;
  undefined8 uVar8;
  code *pcVar9;
  int iVar10;
  undefined *puVar11;
  long lVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  float fVar14;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> f0;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  fvar<float,_2UL> fVar19;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> b0;
  func<float> local_b8;
  float local_ac;
  undefined1 local_a8 [16];
  float local_90;
  float local_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  float local_68;
  undefined4 uStack_64;
  undefined8 local_58;
  float fStack_50;
  float fStack_4c;
  double local_48;
  double local_40;
  double local_38;
  
  fVar2 = (func<float>)(opt->Jx)._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar4 = *piVar5;
  *piVar5 = 0;
  fVar13 = strtof((char *)fVar2,(char **)&local_b8);
  if (local_b8 == fVar2) {
    std::__throw_invalid_argument("stof");
LAB_001290ba:
    std::__throw_invalid_argument("stof");
LAB_001290c6:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this,"Temperature should be positive");
  }
  else {
    iVar10 = *piVar5;
    local_68 = fVar13;
    uStack_64 = extraout_XMM0_Db;
    if (iVar10 == 0) {
LAB_00128b19:
      *piVar5 = iVar4;
      iVar10 = iVar4;
    }
    else if (iVar10 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00128b19;
    }
    fVar2 = (func<float>)(opt->Jy)._M_dataplus._M_p;
    *piVar5 = 0;
    fVar13 = strtof((char *)fVar2,(char **)&local_b8);
    if (local_b8 == fVar2) goto LAB_001290ba;
    local_78 = fVar13;
    uStack_74 = extraout_XMM0_Db_00;
    if (*piVar5 == 0) {
LAB_00128b5d:
      *piVar5 = iVar10;
    }
    else if (*piVar5 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00128b5d;
    }
    psVar1 = &opt->Tmin;
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar4 != 0) {
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) goto LAB_00128bd2;
      fVar2 = (func<float>)(psVar1->_M_dataplus)._M_p;
      iVar4 = *piVar5;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) {
        std::__throw_invalid_argument("stof");
LAB_0012915b:
        std::__throw_invalid_argument("stof");
LAB_00129167:
        uVar8 = std::__throw_invalid_argument("stof");
        __cxa_free_exception(piVar5);
        _Unwind_Resume(uVar8);
      }
      iVar10 = *piVar5;
      local_ac = fVar13;
      if (iVar10 == 0) {
        *piVar5 = iVar4;
      }
      else {
        iVar4 = iVar10;
        if (iVar10 == 0x22) {
          std::__throw_out_of_range("stof");
          goto LAB_00128bd2;
        }
      }
      fVar2 = (func<float>)(opt->Tmax)._M_dataplus._M_p;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) goto LAB_0012915b;
      iVar10 = *piVar5;
      local_a8._0_4_ = fVar13;
      if (iVar10 == 0) {
LAB_00128d30:
        *piVar5 = iVar4;
        iVar10 = iVar4;
      }
      else if (iVar10 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_00128d30;
      }
      fVar2 = (func<float>)(opt->dT)._M_dataplus._M_p;
      *piVar5 = 0;
      fVar13 = strtof((char *)fVar2,(char **)&local_b8);
      if (local_b8 == fVar2) goto LAB_00129167;
      fVar14 = (float)local_a8._0_4_;
      fVar17 = local_ac;
      if (*piVar5 == 0) {
LAB_00128d7c:
        *piVar5 = iVar10;
      }
      else if (*piVar5 == 0x22) {
        fVar13 = (float)std::__throw_out_of_range("stof");
        goto LAB_00128d7c;
      }
LAB_00128d7f:
      lVar12 = std::cout;
      if ((0.0 <= fVar14) && (0.0 <= fVar17)) {
        if (fVar14 < fVar17) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    ((invalid_argument *)this,"Tmax should be larger than Tmin");
        }
        else {
          local_a8._0_4_ = fVar14;
          local_ac = fVar17;
          local_90 = fVar13;
          if (0.0 < fVar13) {
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
                 0x100;
            *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar12 + -0x18)) =
                 6;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# lattice: square\n",0x12);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"# precision: ",0xd);
            plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
            std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
            std::ostream::put((char)plVar6);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n",0x20);
            local_38 = (double)local_90 * 0.0001 + (double)(float)local_a8._0_4_;
            local_58 = (double)local_ac;
            if (local_58 < local_38) {
              local_40 = (double)local_68;
              local_48 = (double)local_78;
              do {
                local_a8 = ZEXT416((uint)(1.0 / local_ac));
                auVar18._4_12_ = DAT_00170030._4_12_;
                auVar18._0_4_ = 1.0 / local_ac;
                fVar19.v._M_elems._0_8_ = auVar18._0_8_;
                fVar19.v._M_elems[2] = 0.0;
                fVar19 = ising::free_energy::square::
                         infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                                   ((square *)poVar7,local_68,local_78,fVar19);
                local_8c = fVar19.v._M_elems[2];
                local_88._8_4_ = extraout_XMM0_Dc;
                local_88._0_8_ = fVar19.v._M_elems._0_8_;
                local_88._12_4_ = extraout_XMM0_Dd;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"inf inf ",8);
                poVar7 = std::ostream::_M_insert<double>(local_40);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                poVar7 = std::ostream::_M_insert<double>(local_48);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                poVar7 = std::ostream::_M_insert<double>(local_58);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                poVar7 = std::ostream::_M_insert<double>((double)(float)local_a8._0_4_);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                poVar7 = std::ostream::_M_insert<double>((double)(float)local_88._0_4_);
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                local_58 = (double)CONCAT44(local_88._4_4_,local_88._4_4_);
                fStack_50 = (float)local_88._4_4_;
                fStack_4c = (float)local_88._4_4_;
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)((float)local_a8._0_4_ * (float)local_88._4_4_ +
                                            (float)local_88._0_4_));
                local_b8.Jx_._0_1_ = 0x20;
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_b8,1);
                poVar7 = std::ostream::_M_insert<double>
                                   ((double)(-(float)local_a8._0_4_ * (float)local_a8._0_4_ *
                                            ((float)local_58 + (float)local_58 +
                                            (local_8c + local_8c) * (float)local_a8._0_4_)));
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                poVar7 = (ostream *)std::ostream::put((char)poVar7);
                std::ostream::flush();
                local_ac = local_ac + local_90;
                local_58 = (double)local_ac;
              } while (local_58 < local_38);
            }
            return;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument((invalid_argument *)this,"dT should be positive");
        }
        goto LAB_0012913c;
      }
      goto LAB_001290c6;
    }
LAB_00128bd2:
    auVar15._4_4_ = uStack_64;
    auVar15._0_4_ = local_68;
    auVar15._8_4_ = uStack_64;
    auVar15._12_4_ = uStack_74;
    auVar16._8_8_ = auVar15._8_8_;
    auVar16._4_4_ = local_78;
    auVar16._0_4_ = local_68;
    auVar16 = auVar16 & _DAT_00170020;
    if (0.0 < auVar16._0_4_ * auVar16._4_4_) {
      fVar13 = auVar16._4_4_ + auVar16._0_4_;
      fVar13 = 1.0 / (fVar13 + fVar13);
      local_a8 = ZEXT416((uint)fVar13);
      local_b8 = auVar16._0_8_;
      aVar3 = anon_unknown.dwarf_d2c6e::func<float>::operator()(&local_b8,fVar13);
      fVar13 = aVar3.v._M_elems[0];
      fVar14 = aVar3.v._M_elems[1];
      lVar12 = 0x100;
      do {
        local_88 = local_a8;
        local_a8._0_4_ = (float)local_a8._0_4_ - fVar13 / fVar14;
        aVar3 = anon_unknown.dwarf_d2c6e::func<float>::operator()(&local_b8,(float)local_a8._0_4_);
        fVar13 = aVar3.v._M_elems[0];
        fVar14 = aVar3.v._M_elems[1];
        if ((ABS((float)local_a8._0_4_ - (float)local_88._0_4_) <
             (ABS((float)local_88._0_4_) + ABS((float)local_88._0_4_)) * 1.1920929e-07) ||
           (ABS(fVar13) < 2.3841858e-07)) {
          fVar13 = 1.0 / (float)local_a8._0_4_;
          fVar14 = fVar13;
          fVar17 = fVar13;
          goto LAB_00128d7f;
        }
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"convergence error");
      puVar11 = &std::runtime_error::typeinfo;
      pcVar9 = std::runtime_error::~runtime_error;
      goto LAB_00128cc7;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument((invalid_argument *)this,"Jx * Jy should be non-zero");
  }
LAB_0012913c:
  puVar11 = &std::invalid_argument::typeinfo;
  pcVar9 = std::invalid_argument::~invalid_argument;
LAB_00128cc7:
  __cxa_throw(this,puVar11,pcVar9);
}

Assistant:

void calc(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << (1 / t)
              << ' ' << free_energy(f, beta) << ' ' << energy(f, beta) << ' '
              << specific_heat(f, beta) << std::endl;
  }
}